

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4plus.hpp
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,status_type *S)

{
  undefined4 uVar1;
  uint uVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  long lVar4;
  ulong uVar5;
  status_type S_new;
  delim_c local_2039;
  undefined1 local_2038 [8200];
  
  memset(local_2038,0,0x2004);
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_2039.c = '(';
  pbVar3 = utility::operator>>(in,&local_2039);
  std::istream::_M_extract<unsigned_int>((uint *)pbVar3);
  uVar2 = int_math::ceil2<unsigned_int>(0x209);
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      local_2039.c = ' ';
      pbVar3 = utility::operator>>(in,&local_2039);
      std::istream::_M_extract<unsigned_long>((ulong *)pbVar3);
      uVar5 = uVar5 + 1;
      uVar2 = int_math::ceil2<unsigned_int>(0x209);
    } while (uVar5 < uVar2);
  }
  local_2039.c = ')';
  utility::operator>>(in,&local_2039);
  lVar4 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    memcpy(S,local_2038,0x2004);
    lVar4 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, status_type &S) {
        status_type S_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> S_new.index;
        for (unsigned int i{0}; i < S.size(); ++i)
          in >> utility::delim(' ') >> S_new.r[i];
        in >> utility::delim(')');
        if (in)
          S = S_new;
        in.flags(flags);
        return in;
      }